

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O0

void __thiscall CppUnit::PlugInManager::removeXmlOutputterHooks(PlugInManager *this)

{
  bool bVar1;
  reference pPVar2;
  iterator local_50;
  undefined1 local_30 [8];
  iterator it;
  PlugInManager *this_local;
  
  it._M_node = (_Map_pointer)this;
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  begin((iterator *)local_30,&this->m_plugIns);
  while( true ) {
    std::
    deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
    end(&local_50,&this->m_plugIns);
    bVar1 = std::operator!=((_Self *)local_30,&local_50);
    if (!bVar1) break;
    pPVar2 = std::
             _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
             ::operator*((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                          *)local_30);
    (*pPVar2->m_interface->_vptr_CppUnitTestPlugIn[4])();
    std::
    _Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
    ::operator++((_Deque_iterator<CppUnit::PlugInManager::PlugInInfo,_CppUnit::PlugInManager::PlugInInfo_&,_CppUnit::PlugInManager::PlugInInfo_*>
                  *)local_30);
  }
  return;
}

Assistant:

void 
PlugInManager::removeXmlOutputterHooks()
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
    (*it).m_interface->removeXmlOutputterHooks();
}